

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O2

void __thiscall ODDLParser::Reference::Reference(Reference *this,Reference *ref)

{
  Name **ppNVar1;
  Name *this_00;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = ref->m_numRefs;
  this->m_numRefs = uVar2;
  if (uVar2 != 0) {
    ppNVar1 = (Name **)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    this->m_referencedName = ppNVar1;
    for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
      this_00 = (Name *)operator_new(0x10);
      Name::Name(this_00,ref->m_referencedName[uVar3]);
      this->m_referencedName[uVar3] = this_00;
      uVar2 = this->m_numRefs;
    }
  }
  return;
}

Assistant:

Reference::Reference(const Reference &ref) {
    m_numRefs=ref.m_numRefs;
    if(m_numRefs!=0){
        m_referencedName = new Name*[m_numRefs];
        for ( size_t i = 0; i < m_numRefs; i++ ) {
            m_referencedName[i] = new Name(*ref.m_referencedName[i]);
        }
    }
}